

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zarray.c
# Opt level: O2

int zstrcmp(void *a_pp,void *b_pp)

{
  uint __line;
  int iVar1;
  char *__assertion;
  
  if (a_pp == (void *)0x0) {
    __assertion = "a_pp != NULL";
    __line = 0x25;
  }
  else {
    if (b_pp != (void *)0x0) {
      iVar1 = strcmp(*a_pp,*b_pp);
      return iVar1;
    }
    __assertion = "b_pp != NULL";
    __line = 0x26;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.c"
                ,__line,"int zstrcmp(const void *, const void *)");
}

Assistant:

int zstrcmp(const void * a_pp, const void * b_pp)
{
    assert(a_pp != NULL);
    assert(b_pp != NULL);

    char * a = *(void**)a_pp;
    char * b = *(void**)b_pp;

    return strcmp(a,b);
}